

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsLoadMS::Run(BasicAllTargetsLoadMS *this)

{
  bool bVar1;
  Vector<unsigned_int,_4> local_7c;
  Vector<unsigned_int,_4> local_6c;
  Vector<int,_4> local_5c;
  Vector<int,_4> local_4c;
  int local_3c;
  GLint isamples;
  Vector<float,_4> local_28;
  BasicAllTargetsLoadMS *local_18;
  BasicAllTargetsLoadMS *this_local;
  
  local_18 = this;
  bVar1 = ShaderImageLoadStoreBase::SupportedSamples(&this->super_ShaderImageLoadStoreBase,4);
  if (bVar1) {
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    tcu::Vector<float,_4>::Vector(&local_28,-1.0,10.0,-200.0,3000.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&stack0xffffffffffffffc8,-1.0,10.0,-200.0,3000.0);
    bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadMS::ReadMS<tcu::Vector<float,4>>
                      ((BasicAllTargetsLoadMS *)this,0x8814,&local_28,
                       (Vector<float,_4> *)&stack0xffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      glu::CallLogWrapper::glGetIntegerv
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x9110,&local_3c);
      if (3 < local_3c) {
        tcu::Vector<int,_4>::Vector(&local_4c,1,-2,3,-4);
        tcu::Vector<int,_4>::Vector(&local_5c,1,-2,3,-4);
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadMS::ReadMS<tcu::Vector<int,4>>
                          ((BasicAllTargetsLoadMS *)this,0x8d82,&local_4c,&local_5c);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local = (BasicAllTargetsLoadMS *)&DAT_ffffffffffffffff;
          return (long)this_local;
        }
        tcu::Vector<unsigned_int,_4>::Vector(&local_6c,1,2,3,4);
        tcu::Vector<unsigned_int,_4>::Vector(&local_7c,1,2,3,4);
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadMS::
                ReadMS<tcu::Vector<unsigned_int,4>>
                          ((BasicAllTargetsLoadMS *)this,0x8d70,&local_6c,&local_7c);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local = (BasicAllTargetsLoadMS *)&DAT_ffffffffffffffff;
          return (long)this_local;
        }
      }
      this_local = (BasicAllTargetsLoadMS *)0x0;
    }
    else {
      this_local = (BasicAllTargetsLoadMS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllTargetsLoadMS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!ReadMS(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;

		GLint isamples;
		glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
		if (isamples >= 4)
		{
			if (!ReadMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
				return ERROR;
			if (!ReadMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
				return ERROR;
		}

		return NO_ERROR;
	}